

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

Graph * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::visit(QualifiedIdentifierResolver *this,Graph *g)

{
  Graph *pGVar1;
  Graph *result;
  pool_ptr<soul::AST::ModuleBase> local_20;
  pool_ptr<soul::AST::ModuleBase> lastModule;
  Graph *g_local;
  QualifiedIdentifierResolver *this_local;
  
  local_20.object = (this->currentModule).object;
  lastModule.object = (ModuleBase *)g;
  pool_ptr<soul::AST::ModuleBase>::pool_ptr<soul::AST::Graph,void>
            ((pool_ptr<soul::AST::ModuleBase> *)&result,g);
  (this->currentModule).object = (ModuleBase *)result;
  pool_ptr<soul::AST::ModuleBase>::~pool_ptr((pool_ptr<soul::AST::ModuleBase> *)&result);
  pGVar1 = ModuleInstanceResolver::visit
                     (&this->super_ModuleInstanceResolver,(Graph *)lastModule.object);
  (this->currentModule).object = local_20.object;
  pool_ptr<soul::AST::ModuleBase>::~pool_ptr(&local_20);
  return pGVar1;
}

Assistant:

AST::Graph& visit (AST::Graph& g) override
        {
            auto lastModule = currentModule;
            currentModule = g;
            auto& result = ModuleInstanceResolver::visit (g);
            currentModule = lastModule;
            return result;
        }